

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find_position<HashObject<4,4>>
          (sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
           *this,HashObject<4,_4> *key)

{
  long lVar1;
  bool bVar2;
  const_reference ppVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  lVar1 = *(long *)(this + 0x48);
  g_num_hashes = g_num_hashes + 1;
  uVar6 = (ulong)key->i_;
  uVar7 = 0xffffffffffffffff;
  lVar8 = 1;
  do {
    uVar6 = uVar6 & lVar1 - 1U;
    uVar5 = uVar6 / 3 & 0xfffffffffffffff0;
    uVar4 = (int)uVar6 + (int)uVar5 * -3;
    if ((((((sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
             *)(this + 0x30))->groups).
          super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->bitmap[(uVar4 >> 3) + uVar5] >> (uVar4 & 7) &
        1) == 0) {
      uVar5 = uVar6;
      if (uVar7 != 0xffffffffffffffff) {
        uVar5 = uVar7;
      }
      uVar6 = 0xffffffffffffffff;
LAB_00128357:
      pVar9.second = uVar5;
      pVar9.first = uVar6;
      return pVar9;
    }
    bVar2 = sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                            *)this,uVar6);
    if (bVar2) {
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar6;
      }
    }
    else {
      ppVar3 = sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::unsafe_get((sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)(this + 0x30),uVar6);
      if (key->i_ == (ppVar3->first).i_) {
        uVar5 = 0xffffffffffffffff;
        goto LAB_00128357;
      }
    }
    uVar6 = uVar6 + lVar8;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }